

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O2

void rndcurse(void)

{
  boolean bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  obj **ppoVar6;
  char *pcVar7;
  char *pcVar8;
  obj *otmp;
  int x;
  char *pcVar9;
  char Your_buf [256];
  
  if (((uwep != (obj *)0x0) && (uwep->oartifact == '\n')) &&
     (uVar3 = mt_random(), uVar3 % 0x14 != 0)) {
    pline("You feel a malignant aura surround %s.","the magic-absorbing blade");
    return;
  }
  if ((u.uprops[0x2c].extrinsic != 0) ||
     ((u.umonnum != u.umonster && (bVar1 = resists_magm(&youmonst), bVar1 != '\0')))) {
    shieldeff(u.ux,u.uy);
    pline("You feel a malignant aura surround %s.","you");
  }
  ppoVar6 = &invent;
  x = 0;
  while (ppoVar6 = &((obj *)ppoVar6)->nobj->nobj, (obj *)ppoVar6 != (obj *)0x0) {
    x = x + (uint)(((obj *)ppoVar6)->oclass != '\f');
  }
  if (x != 0) {
    cVar2 = '\x02';
    if ((u.uprops[0x2c].extrinsic == 0) && (cVar2 = '\x01', u.umonnum != u.umonster)) {
      bVar1 = resists_magm(&youmonst);
      cVar2 = '\x02' - (bVar1 == '\0');
    }
    for (iVar4 = rnd((uint)(6 / (byte)((u.uprops[0x32].extrinsic != 0 ||
                                       u.uprops[0x32].intrinsic != 0) + cVar2))); 0 < iVar4;
        iVar4 = iVar4 + -1) {
      iVar5 = rnd(x);
      ppoVar6 = &invent;
      do {
        ppoVar6 = &((obj *)ppoVar6)->nobj->nobj;
        if ((obj *)ppoVar6 == (obj *)0x0) goto LAB_00234690;
      } while ((((obj *)ppoVar6)->oclass == '\f') || (iVar5 = iVar5 + -1, iVar5 != 0));
      if ((((obj *)ppoVar6)->field_0x4a & 1) == 0) {
        if (((((obj *)ppoVar6)->oartifact == '\0') ||
            (bVar1 = spec_ability((obj *)ppoVar6,4), bVar1 == '\0')) ||
           (uVar3 = mt_random(), 7 < uVar3 % 10)) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00234519;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00234514;
LAB_0023453f:
            Shk_Your(Your_buf,(obj *)ppoVar6);
          }
          else {
LAB_00234514:
            if (ublindf != (obj *)0x0) {
LAB_00234519:
              if (ublindf->oartifact == '\x1d') goto LAB_0023453f;
            }
          }
          if ((((obj *)ppoVar6)->field_0x4a & 2) == 0) {
            if (flags.verbose != '\0') {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0023457b;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00234572;
LAB_002345d5:
                pcVar7 = aobjnam((obj *)ppoVar6,"glow");
                pcVar8 = hcolor("black");
                pcVar8 = an(pcVar8);
                pline("%s %s with %s aura.",Your_buf,pcVar7,pcVar8);
              }
              else {
LAB_00234572:
                if (ublindf != (obj *)0x0) {
LAB_0023457b:
                  if (ublindf->oartifact == '\x1d') goto LAB_002345d5;
                }
              }
            }
            curse((obj *)ppoVar6);
          }
          else {
            if (flags.verbose != '\0') {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002345a8;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0023459f;
LAB_00234648:
                pcVar7 = aobjnam((obj *)ppoVar6,"glow");
                pcVar8 = hcolor("brown");
                pline("%s %s %s.",Your_buf,pcVar7,pcVar8);
              }
              else {
LAB_0023459f:
                if (ublindf != (obj *)0x0) {
LAB_002345a8:
                  if (ublindf->oartifact == '\x1d') goto LAB_00234648;
                }
              }
            }
            unbless((obj *)ppoVar6);
          }
          ((obj *)ppoVar6)->field_0x4a = ((obj *)ppoVar6)->field_0x4a | 0x40;
        }
        else {
          pcVar7 = Tobjnam((obj *)ppoVar6,"resist");
          pline("%s!",pcVar7);
        }
      }
LAB_00234690:
    }
    update_inventory();
  }
  if (u.usteed == (monst *)0x0) {
    return;
  }
  uVar3 = mt_random();
  if ((uVar3 & 3) != 0) {
    return;
  }
  otmp = which_armor(u.usteed,0x100000);
  if (otmp == (obj *)0x0) {
    return;
  }
  if ((*(uint *)&otmp->field_0x4a & 1) != 0) {
    return;
  }
  if ((*(uint *)&otmp->field_0x4a & 2) == 0) {
    curse(otmp);
  }
  else {
    unbless(otmp);
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_00234733;
      goto LAB_00234708;
    }
  }
  else {
LAB_00234708:
    if (ublindf == (obj *)0x0) {
      return;
    }
  }
  if (ublindf->oartifact != '\x1d') {
    return;
  }
LAB_00234733:
  pcVar7 = y_monnam(u.usteed);
  pcVar7 = upstart(pcVar7);
  pcVar7 = s_suffix(pcVar7);
  pcVar8 = aobjnam(otmp,"glow");
  pcVar9 = "black";
  if ((otmp->field_0x4a & 1) == 0) {
    pcVar9 = "brown";
  }
  pcVar9 = hcolor(pcVar9);
  pline("%s %s %s.",pcVar7,pcVar8,pcVar9);
  otmp->field_0x4a = otmp->field_0x4a | 0x40;
  return;
}

Assistant:

void rndcurse(void)
{
	int	nobj = 0;
	int	cnt, onum;
	struct	obj	*otmp;
	static const char mal_aura[] = "You feel a malignant aura surround %s.";

	if (uwep && (uwep->oartifact == ART_MAGICBANE) && rn2(20)) {
	    pline(mal_aura, "the magic-absorbing blade");
	    return;
	}

	if (Antimagic) {
	    shieldeff(u.ux, u.uy);
	    pline(mal_aura, "you");
	}

	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    /* gold isn't subject to being cursed or blessed */
	    if (otmp->oclass == COIN_CLASS) continue;
	    nobj++;
	}
	if (nobj) {
	    for (cnt = rnd(6/((!!Antimagic) + (!!Half_spell_damage) + 1));
		 cnt > 0; cnt--)  {
		char Your_buf[BUFSZ];

		onum = rnd(nobj);
		for (otmp = invent; otmp; otmp = otmp->nobj) {
		    /* as above */
		    if (otmp->oclass == COIN_CLASS) continue;
		    if (--onum == 0) break;	/* found the target */
		}
		/* the !otmp case should never happen; picking an already
		   cursed item happens--avoid "resists" message in that case */
		if (!otmp || otmp->cursed) continue;	/* next target */

		if (otmp->oartifact && spec_ability(otmp, SPFX_INTEL) &&
		   rn2(10) < 8) {
		    pline("%s!", Tobjnam(otmp, "resist"));
		    continue;
		}

		if (!Blind) Shk_Your(Your_buf, otmp);
		if (otmp->blessed) {
		    if (flags.verbose && !Blind) {
			pline("%s %s %s.",
			      Your_buf,
			      aobjnam(otmp, "glow"),
			      hcolor("brown"));
		    }
		    unbless(otmp);
		} else {
		    if (flags.verbose && !Blind) {
			pline("%s %s with %s aura.",
			      Your_buf,
			      aobjnam(otmp, "glow"),
			      an(hcolor("black")));
		    }
		    curse(otmp);
		}
		otmp->bknown = TRUE;
	    }
	    update_inventory();
	}

	/* treat steed's saddle as extended part of hero's inventory */
	if (u.usteed && !rn2(4) &&
		(otmp = which_armor(u.usteed, W_SADDLE)) != 0 &&
		!otmp->cursed) {	/* skip if already cursed */
	    if (otmp->blessed)
		unbless(otmp);
	    else
		curse(otmp);
	    if (!Blind) {
		pline("%s %s %s.",
		      s_suffix(upstart(y_monnam(u.usteed))),
		      aobjnam(otmp, "glow"),
		      hcolor(otmp->cursed ? "black" : "brown"));
		otmp->bknown = TRUE;
	    }
	}
}